

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

_Bool duckdb_je_extent_commit_zero
                (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,_Bool commit,_Bool zero,
                _Bool growing_retained)

{
  _Bool _Var1;
  undefined7 in_register_00000009;
  ulong __n;
  void *__s;
  
  if (((int)CONCAT71(in_register_00000009,commit) == 0) || ((edata->e_bits & 0x2000) != 0)) {
    if (!zero) {
      return false;
    }
  }
  else {
    _Var1 = extent_commit_impl(tsdn,ehooks,edata,0,(edata->field_2).e_size_esn & 0xfffffffffffff000,
                               growing_retained);
    if (!zero || _Var1) {
      return _Var1;
    }
  }
  if ((edata->e_bits & 0x8000) == 0) {
    __s = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
    __n = (edata->field_2).e_size_esn & 0xfffffffffffff000;
    if ((extent_hooks_t *)(ehooks->ptr).repr != &duckdb_je_ehooks_default_extent_hooks) {
      switchD_012e3010::default(__s,0,__n);
      return false;
    }
    duckdb_je_ehooks_default_zero_impl(__s,__n);
  }
  return false;
}

Assistant:

bool
extent_commit_zero(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    bool commit, bool zero, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);

	if (commit && !edata_committed_get(edata)) {
		if (extent_commit_impl(tsdn, ehooks, edata, 0,
		    edata_size_get(edata), growing_retained)) {
			return true;
		}
	}
	if (zero && !edata_zeroed_get(edata)) {
		void *addr = edata_base_get(edata);
		size_t size = edata_size_get(edata);
		ehooks_zero(tsdn, ehooks, addr, size);
	}
	return false;
}